

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O3

ze_result_t
tracing_layer::zeCommandListAppendLaunchMultipleKernelsIndirect
          (ze_command_list_handle_t hCommandList,uint32_t numKernels,ze_kernel_handle_t *phKernels,
          uint32_t *pCountBuffer,ze_group_count_t *pLaunchArgumentsBuffer,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ulong uVar1;
  _func_void__ze_command_list_append_launch_multiple_kernels_indirect_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var2;
  _func__ze_result_t__ze_command_list_handle_t_ptr_uint__ze_kernel_handle_t_ptr_ptr_uint_ptr__ze_group_count_t_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  uint32_t uVar3;
  ze_event_handle_t *pp_Var4;
  _ze_result_t _Var5;
  char *pcVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  uint32_t numKernels_local;
  ze_event_handle_t hSignalEvent_local;
  ze_group_count_t *pLaunchArgumentsBuffer_local;
  uint32_t *pCountBuffer_local;
  ze_kernel_handle_t *phKernels_local;
  ze_command_list_handle_t hCommandList_local;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_c0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_command_list_append_launch_multiple_kernels_indirect_params_t tracerParams;
  
  pp_Var4 = phWaitEvents;
  uVar3 = numWaitEvents;
  if (DAT_00183408 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr_uint__ze_kernel_handle_t_ptr_ptr_uint_ptr__ze_group_count_t_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
       *)0x0) {
    _Var5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    numKernels_local = numKernels;
    hSignalEvent_local = hSignalEvent;
    pLaunchArgumentsBuffer_local = pLaunchArgumentsBuffer;
    pCountBuffer_local = pCountBuffer;
    phKernels_local = phKernels;
    hCommandList_local = hCommandList;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar6 = (char *)__tls_get_addr(&PTR_00182fa0);
    if (*pcVar6 == '\0') {
      tracing_layer::tracingInProgress::__tls_init();
      *pcVar6 = '\x01';
      tracerParams.phCommandList = &hCommandList_local;
      tracerParams.pnumKernels = &numKernels_local;
      tracerParams.pphKernels = &phKernels_local;
      tracerParams.ppCountBuffer = &pCountBuffer_local;
      tracerParams.ppLaunchArgumentsBuffer = &pLaunchArgumentsBuffer_local;
      tracerParams.phSignalEvent = &hSignalEvent_local;
      tracerParams.pnumWaitEvents = &numWaitEvents;
      tracerParams.pphWaitEvents = &phWaitEvents;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apiCallbackData.apiOrdinal =
           (_func_void__ze_command_list_append_launch_multiple_kernels_indirect_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
            *)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar7 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if ((puVar7 != (ulong *)0x0) && (*puVar7 != 0)) {
        lVar8 = 0xcb0;
        uVar9 = 0;
        do {
          uVar1 = puVar7[1];
          prologCallback.current_api_callback =
               *(_func_void__ze_command_list_append_launch_multiple_kernels_indirect_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)((uVar1 - 0x9d8) + lVar8);
          p_Var2 = *(_func_void__ze_command_list_append_launch_multiple_kernels_indirect_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)((uVar1 - 0x380) + lVar8);
          prologCallback.pUserData = *(void **)(uVar1 + lVar8);
          if (apiCallbackData.prologCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              apiCallbackData.prologCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>>>
                        *)&apiCallbackData.prologCallbacks,
                       (iterator)
                       apiCallbackData.prologCallbacks.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&prologCallback);
          }
          else {
            (apiCallbackData.prologCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
                 prologCallback.current_api_callback;
            (apiCallbackData.prologCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = prologCallback.pUserData;
            apiCallbackData.prologCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 apiCallbackData.prologCallbacks.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          epilogCallback.pUserData = *(void **)(puVar7[1] + lVar8);
          epilogCallback.current_api_callback = p_Var2;
          if (apiCallbackData.epilogCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              apiCallbackData.epilogCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>>>
                        *)&apiCallbackData.epilogCallbacks,
                       (iterator)
                       apiCallbackData.epilogCallbacks.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&epilogCallback);
          }
          else {
            (apiCallbackData.epilogCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var2;
            (apiCallbackData.epilogCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = epilogCallback.pUserData;
            apiCallbackData.epilogCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 apiCallbackData.epilogCallbacks.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0xcb8;
        } while (uVar9 < *puVar7);
      }
      p_Var2 = apiCallbackData.apiOrdinal;
      zeApiPtr = DAT_00183408;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_a8,&apiCallbackData.prologCallbacks);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_c0,&apiCallbackData.epilogCallbacks);
      _Var5 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,unsigned_int,_ze_kernel_handle_t**,unsigned_int_const*,_ze_group_count_t_const*,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t**),_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,unsigned_int&,_ze_kernel_handle_t**&,unsigned_int_const*&,_ze_group_count_t_const*&,_ze_event_handle_t*&,unsigned_int&,_ze_event_handle_t**&>
                        (zeApiPtr,&tracerParams,p_Var2,&local_a8,&local_c0,&hCommandList_local,
                         &numKernels_local,&phKernels_local,&pCountBuffer_local,
                         &pLaunchArgumentsBuffer_local,&hSignalEvent_local,&numWaitEvents,
                         &phWaitEvents);
      if (local_c0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (apiCallbackData.epilogCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(apiCallbackData.epilogCallbacks.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)apiCallbackData.epilogCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)apiCallbackData.epilogCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (apiCallbackData.prologCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(apiCallbackData.prologCallbacks.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)apiCallbackData.prologCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)apiCallbackData.prologCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_launch_multiple_kernels_indirect_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      _Var5 = (*DAT_00183408)(hCommandList,numKernels,phKernels,pCountBuffer,pLaunchArgumentsBuffer,
                              hSignalEvent,uVar3,pp_Var4);
    }
  }
  return _Var5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendLaunchMultipleKernelsIndirect(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numKernels,                            ///< [in] maximum number of kernels to launch
        ze_kernel_handle_t* phKernels,                  ///< [in][range(0, numKernels)] handles of the kernel objects
        const uint32_t* pCountBuffer,                   ///< [in] pointer to device memory location that will contain the actual
                                                        ///< number of kernels to launch; value must be less than or equal to
                                                        ///< numKernels
        const ze_group_count_t* pLaunchArgumentsBuffer, ///< [in][range(0, numKernels)] pointer to device buffer that will contain
                                                        ///< a contiguous array of thread group launch arguments
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        auto pfnAppendLaunchMultipleKernelsIndirect = context.zeDdiTable.CommandList.pfnAppendLaunchMultipleKernelsIndirect;

        if( nullptr == pfnAppendLaunchMultipleKernelsIndirect)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendLaunchMultipleKernelsIndirect, hCommandList, numKernels, phKernels, pCountBuffer, pLaunchArgumentsBuffer, hSignalEvent, numWaitEvents, phWaitEvents);

        // capture parameters
        ze_command_list_append_launch_multiple_kernels_indirect_params_t tracerParams = {
            &hCommandList,
            &numKernels,
            &phKernels,
            &pCountBuffer,
            &pLaunchArgumentsBuffer,
            &hSignalEvent,
            &numWaitEvents,
            &phWaitEvents
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendLaunchMultipleKernelsIndirectCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendLaunchMultipleKernelsIndirectCb_t, CommandList, pfnAppendLaunchMultipleKernelsIndirectCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendLaunchMultipleKernelsIndirect,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.pnumKernels,
                                                  *tracerParams.pphKernels,
                                                  *tracerParams.ppCountBuffer,
                                                  *tracerParams.ppLaunchArgumentsBuffer,
                                                  *tracerParams.phSignalEvent,
                                                  *tracerParams.pnumWaitEvents,
                                                  *tracerParams.pphWaitEvents);
    }